

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_ObjCutFilterBoth(Jf_Man_t *p,Jf_Cut_t **pSto,int c)

{
  Jf_Cut_t *pJVar1;
  Jf_Cut_t *pJVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar5 = 0;
  uVar7 = 0;
  if (0 < c) {
    uVar7 = (ulong)(uint)c;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pJVar1 = pSto[c];
    pJVar2 = pSto[uVar5];
    if (((pJVar2->pCut[0] <= pJVar1->pCut[0]) && ((pJVar2->Sign & ~pJVar1->Sign) == 0)) &&
       (iVar4 = Jf_CutIsContained1(pJVar1->pCut,pJVar2->pCut), iVar4 != 0)) {
      pSto[c]->pCut[0] = -1;
      return c;
    }
  }
  uVar6 = 0;
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pJVar1 = pSto[c];
    pJVar2 = pSto[uVar5];
    if ((((pJVar2->pCut[0] <= pJVar1->pCut[0]) || ((pJVar1->Sign & ~pJVar2->Sign) != 0)) ||
        (iVar4 = Jf_CutIsContained1(pJVar2->pCut,pJVar1->pCut), uVar3 = uVar6, iVar4 == 0)) &&
       (uVar3 = uVar6 + 1, uVar5 != uVar6)) {
      pJVar1 = pSto[(int)uVar6];
      pSto[(int)uVar6] = pSto[uVar5];
      pSto[uVar5] = pJVar1;
    }
    uVar6 = uVar3;
  }
  if ((int)uVar6 <= c) {
    if ((int)uVar6 < c) {
      pJVar1 = pSto[(int)uVar6];
      pSto[(int)uVar6] = pSto[c];
      pSto[c] = pJVar1;
    }
    return uVar6;
  }
  __assert_fail("last <= c",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaJf.c"
                ,0x30e,"int Jf_ObjCutFilterBoth(Jf_Man_t *, Jf_Cut_t **, int)");
}

Assistant:

int Jf_ObjCutFilterBoth( Jf_Man_t * p, Jf_Cut_t ** pSto, int c )
{
    int k, last;
    // filter this cut using other cuts
    for ( k = 0; k < c; k++ )
        if ( pSto[c]->pCut[0] >= pSto[k]->pCut[0] && 
            (pSto[c]->Sign & pSto[k]->Sign) == pSto[k]->Sign && 
             Jf_CutIsContained1(pSto[c]->pCut, pSto[k]->pCut) )
        {
                pSto[c]->pCut[0] = -1;
                return c;
        }
    // filter other cuts using this cut
    for ( k = last = 0; k < c; k++ )
        if ( !(pSto[c]->pCut[0] < pSto[k]->pCut[0] && 
              (pSto[c]->Sign & pSto[k]->Sign) == pSto[c]->Sign && 
               Jf_CutIsContained1(pSto[k]->pCut, pSto[c]->pCut)) )
        {
            if ( last++ == k )
                continue;
            ABC_SWAP( Jf_Cut_t *, pSto[last-1], pSto[k] );
        }
    assert( last <= c );
    if ( last < c )
        ABC_SWAP( Jf_Cut_t *, pSto[last], pSto[c] );
    return last;
}